

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

int nn_connect(int s,char *addr)

{
  int iVar1;
  int *piVar2;
  char *unaff_retaddr;
  nn_sock *sock;
  int rc;
  int in_stack_ffffffffffffffdc;
  nn_sock **in_stack_ffffffffffffffe0;
  int in_stack_fffffffffffffffc;
  
  iVar1 = nn_global_hold_socket(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  if (iVar1 < 0) {
    iVar1 = -iVar1;
    piVar2 = __errno_location();
    *piVar2 = iVar1;
    iVar1 = -1;
  }
  else {
    iVar1 = nn_global_create_ep(sock,unaff_retaddr,in_stack_fffffffffffffffc);
    if (iVar1 < 0) {
      nn_global_rele_socket((nn_sock *)0x2eb529);
      piVar2 = __errno_location();
      *piVar2 = -iVar1;
      iVar1 = -1;
    }
    else {
      nn_global_rele_socket((nn_sock *)0x2eb550);
    }
  }
  return iVar1;
}

Assistant:

int nn_connect (int s, const char *addr)
{
    int rc;
    struct nn_sock *sock;

    rc = nn_global_hold_socket (&sock, s);
    if (nn_slow (rc < 0)) {
        errno = -rc;
        return -1;
    }

    rc = nn_global_create_ep (sock, addr, 0);
    if (rc < 0) {
        nn_global_rele_socket (sock);
        errno = -rc;
        return -1;
    }

    nn_global_rele_socket (sock);
    return rc;
}